

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_prec.c
# Opt level: O0

void collect_mv_stats_sb(MV_STATS *mv_stats,AV1_COMP *cpi,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  PARTITION_TYPE PVar1;
  int in_ECX;
  int in_EDX;
  MV_STATS *in_RSI;
  BLOCK_SIZE in_R8B;
  int this_mi_col;
  int i_1;
  int this_mi_row;
  int i;
  int qbs;
  int hbs;
  BLOCK_SIZE subsize;
  PARTITION_TYPE partition;
  AV1_COMMON *cm;
  int in_stack_00000060;
  int in_stack_00000064;
  AV1_COMP *in_stack_00000068;
  MV_STATS *in_stack_00000070;
  undefined2 uVar2;
  undefined8 in_stack_ffffffffffffffb0;
  int local_40;
  int local_38;
  AV1_COMMON *cm_00;
  BLOCK_SIZE bsize_00;
  int in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe4;
  int mi_row_00;
  
  uVar2 = (undefined2)((ulong)in_stack_ffffffffffffffb0 >> 0x28);
  mi_row_00 = CONCAT13(in_R8B,in_stack_ffffffffffffffe4);
  cm_00 = (AV1_COMMON *)(in_RSI + 0xca0);
  if ((in_EDX < in_RSI[0xca7].high_prec) && (in_ECX < in_RSI[0xca7].q)) {
    PVar1 = get_partition(cm_00,in_EDX,in_ECX,in_R8B);
    bsize_00 = (BLOCK_SIZE)((ulong)cm_00 >> 0x38);
    get_partition_subsize((BLOCK_SIZE)((ushort)uVar2 >> 8),(PARTITION_TYPE)uVar2);
    switch(PVar1) {
    case '\0':
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      break;
    case '\x01':
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      break;
    case '\x02':
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      break;
    case '\x03':
      collect_mv_stats_sb(in_RSI,(AV1_COMP *)CONCAT44(in_EDX,in_ECX),mi_row_00,
                          in_stack_ffffffffffffffe0,bsize_00);
      collect_mv_stats_sb(in_RSI,(AV1_COMP *)CONCAT44(in_EDX,in_ECX),mi_row_00,
                          in_stack_ffffffffffffffe0,bsize_00);
      collect_mv_stats_sb(in_RSI,(AV1_COMP *)CONCAT44(in_EDX,in_ECX),mi_row_00,
                          in_stack_ffffffffffffffe0,bsize_00);
      collect_mv_stats_sb(in_RSI,(AV1_COMP *)CONCAT44(in_EDX,in_ECX),mi_row_00,
                          in_stack_ffffffffffffffe0,bsize_00);
      break;
    case '\x04':
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      break;
    case '\x05':
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      break;
    case '\x06':
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      break;
    case '\a':
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      break;
    case '\b':
      for (local_38 = 0; local_38 < 4; local_38 = local_38 + 1) {
        collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      }
      break;
    case '\t':
      for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
        collect_mv_stats_b(in_stack_00000070,in_stack_00000068,in_stack_00000064,in_stack_00000060);
      }
    }
  }
  return;
}

Assistant:

static inline void collect_mv_stats_sb(MV_STATS *mv_stats, const AV1_COMP *cpi,
                                       int mi_row, int mi_col,
                                       BLOCK_SIZE bsize) {
  assert(bsize < BLOCK_SIZES_ALL);
  const AV1_COMMON *cm = &cpi->common;

  if (mi_row >= cm->mi_params.mi_rows || mi_col >= cm->mi_params.mi_cols)
    return;

  const PARTITION_TYPE partition = get_partition(cm, mi_row, mi_col, bsize);
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, partition);

  const int hbs = mi_size_wide[bsize] / 2;
  const int qbs = mi_size_wide[bsize] / 4;
  switch (partition) {
    case PARTITION_NONE:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      break;
    case PARTITION_HORZ:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col);
      break;
    case PARTITION_VERT:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col + hbs);
      break;
    case PARTITION_SPLIT:
      collect_mv_stats_sb(mv_stats, cpi, mi_row, mi_col, subsize);
      collect_mv_stats_sb(mv_stats, cpi, mi_row, mi_col + hbs, subsize);
      collect_mv_stats_sb(mv_stats, cpi, mi_row + hbs, mi_col, subsize);
      collect_mv_stats_sb(mv_stats, cpi, mi_row + hbs, mi_col + hbs, subsize);
      break;
    case PARTITION_HORZ_A:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col + hbs);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col);
      break;
    case PARTITION_HORZ_B:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_VERT_A:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col + hbs);
      break;
    case PARTITION_VERT_B:
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col);
      collect_mv_stats_b(mv_stats, cpi, mi_row, mi_col + hbs);
      collect_mv_stats_b(mv_stats, cpi, mi_row + hbs, mi_col + hbs);
      break;
    case PARTITION_HORZ_4:
      for (int i = 0; i < 4; ++i) {
        const int this_mi_row = mi_row + i * qbs;
        collect_mv_stats_b(mv_stats, cpi, this_mi_row, mi_col);
      }
      break;
    case PARTITION_VERT_4:
      for (int i = 0; i < 4; ++i) {
        const int this_mi_col = mi_col + i * qbs;
        collect_mv_stats_b(mv_stats, cpi, mi_row, this_mi_col);
      }
      break;
    default: assert(0);
  }
}